

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlslangToSpv.cpp
# Opt level: O0

Id __thiscall
anon_unknown.dwarf_889438::TGlslangToSpvTraverser::makeArraySizeId
          (TGlslangToSpvTraverser *this,TArraySizes *arraySizes,int dim,bool allowZero,bool boolType
          )

{
  uint u;
  long *plVar1;
  TType *type;
  undefined1 local_40 [4];
  int size;
  SpecConstantOpModeGuard spec_constant_op_mode_setter;
  TIntermTyped *specNode;
  bool boolType_local;
  bool allowZero_local;
  int dim_local;
  TArraySizes *arraySizes_local;
  TGlslangToSpvTraverser *this_local;
  
  spec_constant_op_mode_setter._8_8_ = glslang::TArraySizes::getDimNode(arraySizes,dim);
  if ((TIntermTyped *)spec_constant_op_mode_setter._8_8_ == (TIntermTyped *)0x0) {
    u = glslang::TArraySizes::getDimSize(arraySizes,dim);
    if ((!allowZero) && ((int)u < 1)) {
      __assert_fail("size > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/GlslangToSpv.cpp"
                    ,0x1606,
                    "spv::Id (anonymous namespace)::TGlslangToSpvTraverser::makeArraySizeId(const glslang::TArraySizes &, int, bool, bool)"
                   );
    }
    if (boolType) {
      this_local._4_4_ = spv::Builder::makeBoolConstant(&this->builder,u != 0,false);
    }
    else {
      this_local._4_4_ = spv::Builder::makeUintConstant(&this->builder,u,false);
    }
  }
  else {
    spv::Builder::clearAccessChain(&this->builder);
    anon_unknown_0::SpecConstantOpModeGuard::SpecConstantOpModeGuard
              ((SpecConstantOpModeGuard *)local_40,&this->builder);
    anon_unknown_0::SpecConstantOpModeGuard::turnOnSpecConstantOpMode
              ((SpecConstantOpModeGuard *)local_40);
    (**(code **)(*(long *)spec_constant_op_mode_setter._8_8_ + 0x10))
              (spec_constant_op_mode_setter._8_8_,this);
    plVar1 = (long *)(**(code **)(*(long *)spec_constant_op_mode_setter._8_8_ + 0x18))();
    type = (TType *)(**(code **)(*plVar1 + 0xf0))();
    this_local._4_4_ = accessChainLoad(this,type);
    anon_unknown_0::SpecConstantOpModeGuard::~SpecConstantOpModeGuard
              ((SpecConstantOpModeGuard *)local_40);
  }
  return this_local._4_4_;
}

Assistant:

spv::Id TGlslangToSpvTraverser::makeArraySizeId(const glslang::TArraySizes& arraySizes, int dim, bool allowZero, bool boolType)
{
    // First, see if this is sized with a node, meaning a specialization constant:
    glslang::TIntermTyped* specNode = arraySizes.getDimNode(dim);
    if (specNode != nullptr) {
        builder.clearAccessChain();
        SpecConstantOpModeGuard spec_constant_op_mode_setter(&builder);
        spec_constant_op_mode_setter.turnOnSpecConstantOpMode();
        specNode->traverse(this);
        return accessChainLoad(specNode->getAsTyped()->getType());
    }

    // Otherwise, need a compile-time (front end) size, get it:
    int size = arraySizes.getDimSize(dim);

    if (!allowZero)
        assert(size > 0);

    if (boolType) {
        return builder.makeBoolConstant(size);
    } else {
        return builder.makeUintConstant(size);
    }
}